

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::BSTerase
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this,iterator *position)

{
  node *pnVar1;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *u;
  node *v;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *v_00;
  treeNode<int> *ptVar2;
  Colour CVar3;
  node *v_01;
  undefined1 local_48 [8];
  iterator temp;
  
  pnVar1 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = pnVar1;
  ((this->m_tree).m_last)->parent->right = pnVar1;
  u = (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)position->m_node;
  CVar3 = *(Colour *)((long)&u->NIL + 4);
  v = u->m_root;
  v_01 = u->m_first;
  if (v == pnVar1) {
    transplant(this,(node *)u,v_01);
  }
  else if (v_01 == pnVar1) {
    transplant(this,(node *)u,v);
    v_01 = v;
  }
  else {
    local_48 = (undefined1  [8])&PTR__treeIterator_0010dcf0;
    temp._vptr_treeIterator = (_func_int **)position->m_tree;
    temp.m_tree = u;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_48);
    v_00 = temp.m_tree;
    CVar3 = *(Colour *)((long)&(temp.m_tree)->NIL + 4);
    v_01 = (temp.m_tree)->m_first;
    ptVar2 = v_01;
    if ((RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)(temp.m_tree)->m_last != u) {
      transplant(this,(node *)temp.m_tree,v_01);
      ptVar2 = u->m_first;
      v_00->m_first = ptVar2;
    }
    ptVar2->parent = (treeNode<int> *)v_00;
    transplant(this,(node *)u,(node *)v_00);
    ptVar2 = u->m_root;
    v_00->m_root = ptVar2;
    ptVar2->parent = (treeNode<int> *)v_00;
    *(Colour *)((long)&v_00->NIL + 4) = *(Colour *)((long)&u->NIL + 4);
  }
  operator_delete(u);
  if (CVar3 == BLACK) {
    fixEraseViolation(this,v_01);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}